

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O1

long __thiscall
duckdb::DateSubTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateSubTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  _Head_base<0UL,_unsigned_long_*,_false> this_00;
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  DatePartSpecifier DVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  long lVar8;
  NotImplementedException *this_01;
  date_t input;
  undefined4 in_register_00000084;
  undefined8 local_78;
  long local_70;
  string local_68;
  string local_48;
  
  local_70 = part.value._0_8_;
  p_Var2 = (_Head_base<0UL,_unsigned_long_*,_false> *)CONCAT44(in_register_00000084,enddate.days);
  input.days = part.value._8_4_;
  local_78 = this;
  bVar5 = Value::IsFinite<duckdb::date_t>(input);
  if ((bVar5) && (bVar5 = Value::IsFinite<duckdb::date_t>(startdate), bVar5)) {
    lVar8 = local_70;
    if (((ulong)local_78 & 0xffffffff) < 0xd) {
      lVar8 = (long)&local_78 + 4;
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,lVar8,((ulong)local_78 & 0xffffffff) + lVar8);
    DVar6 = GetDatePartSpecifier(&local_48);
    switch(DVar6) {
    case BEGIN_BIGINT:
    case ISOYEAR:
      lVar8 = DateSub::YearOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case MONTH:
      lVar8 = DateSub::MonthOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      lVar8 = DateSub::DayOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case DECADE:
      lVar8 = DateSub::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case CENTURY:
      lVar8 = DateSub::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLENNIUM:
      lVar8 = DateSub::MilleniumOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MICROSECONDS:
      lVar8 = DateSub::MicrosecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLISECONDS:
      lVar8 = DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      lVar8 = DateSub::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MINUTE:
      lVar8 = DateSub::MinutesOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case HOUR:
      lVar8 = DateSub::HoursOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case WEEK:
    case YEARWEEK:
      lVar8 = DateSub::WeekOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case QUARTER:
      lVar8 = DateSub::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    default:
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Specifier type not implemented for DATESUB","");
      NotImplementedException::NotImplementedException(this_01,&local_68);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    if (p_Var2->_M_head_impl == (unsigned_long *)0x0) {
      local_48._M_dataplus._M_p = (pointer)p_Var2[3]._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long *)&local_48);
      sVar4 = local_68._M_string_length;
      _Var3._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      this_00._M_head_impl = p_Var2[2]._M_head_impl;
      p_Var2[1]._M_head_impl = (unsigned_long *)_Var3._M_p;
      p_Var2[2]._M_head_impl = (unsigned_long *)sVar4;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (p_Var2 + 1));
      p_Var2->_M_head_impl =
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    p_Var2->_M_head_impl[(ulong)mask >> 6] =
         p_Var2->_M_head_impl[(ulong)mask >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    lVar8 = 0;
  }
  return lVar8;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return SubtractDateParts<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}